

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O1

void __thiscall
geometrycentral::
DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_double>_>::
~DependentQuantityD(DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_double>_>
                    *this)

{
  function<void_()> *pfVar1;
  _Manager_type p_Var2;
  
  (this->super_DependentQuantity)._vptr_DependentQuantity =
       (_func_int **)&PTR__DependentQuantity_005f5398;
  p_Var2 = (this->super_DependentQuantity).evaluateFunc.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pfVar1 = &(this->super_DependentQuantity).evaluateFunc;
    (*p_Var2)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  operator_delete(this);
  return;
}

Assistant:

DependentQuantityD(){}